

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCollapsingSortedStoragesList.hpp
# Opt level: O0

void __thiscall
supermap::
BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
::append(BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
         *this,unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               *storage)

{
  initializer_list<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
  __l;
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  pointer pSVar4;
  InnerRegisterSupplier *in_RDI;
  unsigned_long unaff_retaddr;
  shared_ptr<supermap::io::FileManager> *in_stack_00000008;
  string *in_stack_00000010;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  *in_stack_00000018;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  *in_stack_00000020;
  SortedStorage mergedKeys;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  nextNode;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  curNode;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  *in_stack_fffffffffffffde8;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  *in_stack_fffffffffffffdf0;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffdf8;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  *in_stack_fffffffffffffe00;
  iterator in_stack_fffffffffffffe18;
  iterator in_stack_fffffffffffffe20;
  iterator in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  allocator<char> local_151;
  string local_150 [40];
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  *local_128;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  local_120;
  undefined1 local_e8 [56];
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  local_b0 [3];
  InnerRegisterSupplier *registerSupplier;
  
  registerSupplier = in_RDI;
  std::
  make_shared<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>::ListNode,std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>,std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>>,std::shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>::ListNode>,unsigned_long&>
            ((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
              *)in_stack_fffffffffffffe28,
             (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
              *)in_stack_fffffffffffffe20,(unsigned_long *)in_stack_fffffffffffffe18);
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  ::operator=((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
               *)in_stack_fffffffffffffdf0,
              (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
               *)in_stack_fffffffffffffde8);
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  ::~shared_ptr((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)0x2624dd);
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  ::shared_ptr((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                *)in_stack_fffffffffffffdf0,
               (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                *)in_stack_fffffffffffffde8);
  std::
  __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x262503);
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  ::shared_ptr((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                *)in_stack_fffffffffffffdf0,
               (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                *)in_stack_fffffffffffffde8);
  while (bVar1 = std::operator!=((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                                  *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8), bVar1) {
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x26253e);
    uVar2 = ListNode::getRank((ListNode *)in_stack_fffffffffffffdf0);
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x26255d);
    uVar3 = ListNode::getRank((ListNode *)in_stack_fffffffffffffdf0);
    if (uVar2 < uVar3) break;
    local_128 = &local_120;
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2625b9);
    std::
    unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::operator*((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
                 *)in_stack_fffffffffffffdf0);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::SortedSingleFileIndexedStorage(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_128 = (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
                 *)local_e8;
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2625fe);
    std::
    unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::operator*((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
                 *)in_stack_fffffffffffffdf0);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::SortedSingleFileIndexedStorage(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_b0[0].
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    .
    super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    ._vptr_OrderedStorage = (_func_int **)&local_120;
    local_b0[0].
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    .
    super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
    ._vptr_Cloneable =
         (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
          )(_func_int **)0x2;
    std::
    allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
    ::allocator((allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
                 *)0x26264c);
    __l._M_len = (size_type)in_stack_fffffffffffffe30;
    __l._M_array = in_stack_fffffffffffffe28;
    std::
    vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::vector((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
              *)in_stack_fffffffffffffe20,__l,(allocator_type *)in_stack_fffffffffffffe18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
               (allocator<char> *)in_stack_fffffffffffffe20);
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2626aa);
    std::
    unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::operator->((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
                  *)0x2626b2);
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    ::getFileManager(in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI[1]._M_invoker;
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
    ::function(in_stack_fffffffffffffe00,
               (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
                *)in_stack_fffffffffffffdf8);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::SortedSingleFileIndexedStorage
              (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr
               ,registerSupplier);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
    ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
                 *)0x262727);
    std::shared_ptr<supermap::io::FileManager>::~shared_ptr
              ((shared_ptr<supermap::io::FileManager> *)0x262734);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
    std::
    vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::~vector((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               *)in_stack_fffffffffffffe00);
    std::
    allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
    ::~allocator((allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
                  *)0x262768);
    in_stack_fffffffffffffe20 = &local_120;
    in_stack_fffffffffffffe18 = local_b0;
    do {
      in_stack_fffffffffffffe18 = in_stack_fffffffffffffe18 + -1;
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
      ::~SortedSingleFileIndexedStorage
                ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
                  *)0x262791);
    } while (in_stack_fffffffffffffe18 != in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe28 = in_stack_fffffffffffffe18;
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2627b2);
    pSVar4 = std::
             unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
             ::operator->((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
                           *)0x2627ba);
    (*(pSVar4->
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
      ).
      super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
      ._vptr_OrderedStorage[5])
              (pSVar4,&local_b0[0].
                       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                       .storageFile_.
                       super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::
    shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
    ::operator=((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)in_stack_fffffffffffffdf0,
                (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)in_stack_fffffffffffffde8);
    std::
    shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
    ::operator=((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)in_stack_fffffffffffffdf0,
                (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)in_stack_fffffffffffffde8);
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x262806);
    std::
    shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
    ::operator=((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)in_stack_fffffffffffffdf0,
                (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)in_stack_fffffffffffffde8);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::~SortedSingleFileIndexedStorage
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
                *)0x262827);
  }
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  ::~shared_ptr((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)0x26297c);
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  ::~shared_ptr((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
                 *)0x262989);
  return;
}

Assistant:

void append(std::unique_ptr<SortedStorage> &&storage) override {
        head_ = std::make_shared<ListNode>(std::move(storage), std::move(head_), batchSize_);
        std::shared_ptr<ListNode> curNode = head_;
        std::shared_ptr<ListNode> nextNode = curNode->next;
        while (nextNode != nullptr) {
            assert(curNode->getRank() <= nextNode->getRank());
            if (curNode->getRank() < nextNode->getRank()) {
                break;
            }
            assert(curNode->valid());
            assert(nextNode->valid());
            SortedStorage mergedKeys(
                std::vector<SortedStorage>{*nextNode->storage, *curNode->storage},
                "collapse",
                curNode->storage->getFileManager(),
                batchSize_,
                innerRegisterSupplier_
            );
            nextNode->storage->resetWith(std::move(mergedKeys));
            head_ = nextNode;
            curNode = nextNode;
            nextNode = nextNode->next;
        }
    }